

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O1

bool duckdb::TryDecimalStringCast<int,(char)44>
               (char *string_ptr,idx_t string_size,int *result,CastParameters *parameters,
               uint8_t width,uint8_t scale)

{
  byte bVar1;
  ulong uVar2;
  bool strict;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  idx_t iVar9;
  int iVar10;
  char *pcVar11;
  int iVar12;
  undefined7 in_register_00000081;
  uint uVar13;
  undefined7 in_register_00000089;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  ExponentData exponent;
  string_t value;
  bool local_d1;
  DecimalCastData<int> local_d0;
  CastParameters *local_c0;
  int *local_b8;
  ulong local_b0;
  ulong local_a8;
  string local_a0;
  uint local_80;
  undefined4 local_7c;
  undefined8 uStack_78;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  uVar13 = (uint)CONCAT71(in_register_00000089,scale);
  uVar8 = CONCAT71(in_register_00000081,width) & 0xffffffff;
  bVar16 = false;
  local_d0.result = 0;
  local_d0.width = (uint8_t)uVar8;
  local_d0.digit_count = '\0';
  local_d0.decimal_count = '\0';
  local_d0.round_set = false;
  local_d0.should_round = false;
  local_d0.excessive_decimals = '\0';
  local_d0.exponent_type = NONE;
  local_d0.limit = *(StoreType_conflict *)(NumericHelper::POWERS_OF_TEN + uVar8 * 8);
  local_d0.scale = scale;
  if (string_size == 0) goto LAB_0129a191;
  uVar8 = 0;
  do {
    bVar6 = string_ptr[uVar8];
    if ((4 < bVar6 - 9) && (bVar6 != 0x20)) {
      local_d0.digit_count = 0;
      strict = SUB81(parameters,0);
      local_c0 = parameters;
      local_b8 = result;
      if (bVar6 == 0x2d) {
        local_d0.result = 0;
        uVar2 = string_size - uVar8;
        uVar3 = 1;
        goto LAB_01299af8;
      }
      if (bVar6 == 0x30 && string_size - 1 != uVar8) {
        bVar1 = string_ptr[uVar8 + 1];
        if (bVar1 < 0x62) {
          if ((bVar1 == 0x42) || (bVar1 == 0x58)) {
LAB_01299d22:
            if (0xfffffffffffffffd < (string_size - uVar8) - 3) {
              DecimalCastOperation::Finalize<duckdb::DecimalCastData<int>,false>(&local_d0);
              result = local_b8;
            }
            break;
          }
        }
        else if ((bVar1 == 0x62) || (bVar1 == 0x78)) goto LAB_01299d22;
      }
      uVar2 = string_size - uVar8;
      uVar4 = (ulong)(bVar6 == 0x2b);
      local_d0.result = 0;
      uVar3 = uVar4;
      goto LAB_01299d85;
    }
    uVar8 = uVar8 + 1;
  } while (string_size != uVar8);
LAB_0129a18f:
  bVar16 = false;
  goto LAB_0129a191;
LAB_01299af8:
  do {
    if (uVar2 <= uVar3) {
      local_d0._7_3_ = 0;
      goto LAB_01299bed;
    }
    bVar6 = string_ptr[uVar8 + uVar3] - 0x30;
    if (9 < bVar6) {
      local_d0._7_3_ = 0;
      if (string_ptr[uVar8 + uVar3] != ',') goto LAB_01299fe1;
      uVar4 = uVar3 + 1;
      iVar12 = 3;
      uVar5 = uVar4;
      if (uVar2 <= uVar4) goto LAB_01299faf;
      local_d0.decimal_count = 0;
      local_b0 = local_b0 & 0xffffffffffffff00;
      local_d1 = false;
      goto LAB_01299c5e;
    }
    uVar4 = uVar3 + 1;
    if ((bVar6 == 0) && (local_d0.result == 0)) {
LAB_01299b24:
      bVar16 = true;
      if ((~uVar3 + string_size != uVar8) && (string_ptr[uVar8 + 1 + uVar3] == '_')) {
        uVar4 = uVar3 + 2;
        if ((string_size - uVar3) - 2 == uVar8) {
          bVar16 = false;
        }
        else {
          bVar16 = (byte)(string_ptr[uVar8 + uVar4] - 0x30U) < 10;
        }
      }
    }
    else {
      if (((uint)width - (uint)scale != (uint)local_d0.digit_count) &&
         (local_d0.digit_count = local_d0.digit_count + 1, -0xccccccd < local_d0.result)) {
        local_d0.result = local_d0.result * 10 - (uint)bVar6;
        goto LAB_01299b24;
      }
      bVar16 = false;
    }
    uVar3 = uVar4;
  } while (bVar16);
  goto LAB_01299e29;
  while (uVar5 = uVar14, uVar14 < uVar2) {
LAB_01299c5e:
    bVar6 = string_ptr[uVar8 + uVar5] - 0x30;
    local_a8 = uVar4;
    if (9 < bVar6) {
      iVar12 = 0;
      goto LAB_01299f8d;
    }
    if ((local_d0.decimal_count == scale) && ((char)local_b0 == '\0')) {
      local_d1 = 4 < bVar6;
      local_b0 = CONCAT71(local_b0._1_7_,1);
    }
    bVar16 = (uint)local_d0.decimal_count + (uint)local_d0.digit_count < 9;
    iVar12 = local_d0.result * 10 - (uint)bVar6;
    if (!bVar16) {
      iVar12 = local_d0.result;
    }
    local_d0.result = iVar12;
    local_d0.decimal_count = local_d0.decimal_count + bVar16;
    uVar14 = uVar5 + 1;
    if (((~uVar5 + string_size != uVar8) && (string_ptr[uVar8 + 1 + uVar5] == '_')) &&
       ((uVar14 = uVar5 + 2, (string_size - uVar5) - 2 == uVar8 ||
        (9 < (byte)(string_ptr[uVar8 + uVar14] - 0x30U))))) {
      local_d0.round_set = (bool)(char)local_b0;
      local_d0.should_round = local_d1;
      uVar5 = uVar14;
      iVar10 = 1;
      goto LAB_01299fc6;
    }
  }
  iVar12 = 3;
LAB_01299f8d:
  local_d0.round_set = (bool)(char)local_b0;
  local_d0.should_round = local_d1;
LAB_01299faf:
  iVar10 = 1;
  if (uVar4 < uVar5) {
    iVar10 = iVar12;
  }
  if (1 < uVar3) {
    iVar10 = iVar12;
  }
LAB_01299fc6:
  uVar3 = uVar5;
  if (iVar10 != 3) {
    if (iVar10 != 0) goto LAB_0129a18f;
LAB_01299fe1:
    bVar6 = string_ptr[uVar8 + uVar3];
    bVar16 = false;
    uVar7 = (uint)bVar6;
    if (bVar6 < 0x20) {
      if (4 < uVar7 - 9) goto LAB_0129a191;
    }
    else {
      if ((bVar6 == 0x65) || (uVar7 == 0x45)) {
        if ((uVar3 != 1) && (uVar3 + 1 < uVar2)) {
          local_a0._M_dataplus._M_p._0_2_ = 0;
          pcVar11 = string_ptr + uVar8 + uVar3 + 1;
          iVar9 = ~uVar8 + (string_size - uVar3);
          if (*pcVar11 == '-') {
            bVar16 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)44>
                               (pcVar11,iVar9,(IntegerCastData<short> *)&local_a0,strict);
          }
          else {
            bVar16 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)44>
                               (pcVar11,iVar9,(IntegerCastData<short> *)&local_a0,strict);
          }
          if (bVar16 != false) {
            bVar16 = DecimalCastOperation::HandleExponent<duckdb::DecimalCastData<int>,true>
                               (&local_d0,(int)(short)local_a0._M_dataplus._M_p);
            parameters = local_c0;
            result = local_b8;
            goto LAB_0129a191;
          }
          goto LAB_0129a337;
        }
        goto LAB_0129a18f;
      }
      if (uVar7 != 0x20) goto LAB_0129a191;
    }
    uVar4 = uVar3 + 1;
    uVar3 = uVar4;
    if (uVar4 < uVar2) {
      do {
        if ((4 < (byte)string_ptr[uVar8 + uVar4] - 9) && (string_ptr[uVar8 + uVar4] != 0x20))
        goto LAB_0129a18f;
        uVar4 = uVar4 + 1;
        uVar3 = uVar2;
      } while (uVar2 != uVar4);
    }
  }
LAB_01299bed:
  bVar16 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<int>,true>(&local_d0);
  if (bVar16) {
    bVar16 = 1 < uVar3;
    parameters = local_c0;
    result = local_b8;
    goto LAB_0129a191;
  }
  goto LAB_0129a337;
LAB_01299d85:
  do {
    if (uVar2 <= uVar3) {
      local_d0._7_3_ = 0;
      goto LAB_01299e46;
    }
    bVar6 = string_ptr[uVar8 + uVar3] - 0x30;
    if (9 < bVar6) {
      local_d0._7_3_ = 0;
      if (string_ptr[uVar8 + uVar3] != ',') goto LAB_0129a0ed;
      uVar5 = uVar3 + 1;
      iVar12 = 3;
      uVar14 = uVar5;
      if (uVar2 <= uVar5) goto LAB_0129a0b9;
      local_d0.decimal_count = 0;
      local_d0.round_set = false;
      local_d1 = false;
      goto LAB_01299eb6;
    }
    uVar5 = uVar3 + 1;
    if ((bVar6 == 0) && (local_d0.result == 0)) {
LAB_01299db1:
      bVar16 = true;
      if ((~uVar3 + string_size != uVar8) && (string_ptr[uVar8 + 1 + uVar3] == '_')) {
        uVar5 = uVar3 + 2;
        if ((string_size - uVar3) - 2 == uVar8) {
          bVar16 = false;
        }
        else {
          bVar16 = (byte)(string_ptr[uVar8 + uVar5] - 0x30U) < 10;
        }
      }
    }
    else {
      if (((uint)width - (uint)scale != (uint)local_d0.digit_count) &&
         (local_d0.digit_count = local_d0.digit_count + 1, local_d0.result < 0xccccccd)) {
        local_d0.result = (uint)bVar6 + local_d0.result * 10;
        goto LAB_01299db1;
      }
      bVar16 = false;
    }
    uVar3 = uVar5;
  } while (bVar16);
LAB_01299e29:
  local_d0._7_3_ = 0;
  goto LAB_0129a337;
  while (uVar14 = uVar15, uVar15 < uVar2) {
LAB_01299eb6:
    bVar6 = string_ptr[uVar8 + uVar14] - 0x30;
    local_a8 = uVar5;
    if (9 < bVar6) {
      iVar12 = 0;
      goto LAB_0129a096;
    }
    if ((local_d0.decimal_count == scale) && (local_d0.round_set == false)) {
      local_d1 = 4 < bVar6;
      local_d0.round_set = true;
    }
    bVar16 = (uint)local_d0.decimal_count + (uint)local_d0.digit_count < 9;
    iVar12 = (uint)bVar6 + local_d0.result * 10;
    if (!bVar16) {
      iVar12 = local_d0.result;
    }
    local_d0.result = iVar12;
    local_d0.decimal_count = local_d0.decimal_count + bVar16;
    uVar15 = uVar14 + 1;
    if (((~uVar14 + string_size != uVar8) && (string_ptr[uVar8 + 1 + uVar14] == '_')) &&
       ((uVar15 = uVar14 + 2, (string_size - uVar14) - 2 == uVar8 ||
        (9 < (byte)(string_ptr[uVar8 + uVar15] - 0x30U))))) {
      local_d0.should_round = local_d1;
      uVar14 = uVar15;
      iVar10 = 1;
      goto LAB_0129a0cf;
    }
  }
  iVar12 = 3;
LAB_0129a096:
  local_d0.should_round = local_d1;
LAB_0129a0b9:
  iVar10 = 1;
  if (uVar5 < uVar14) {
    iVar10 = iVar12;
  }
  if (uVar4 < uVar3) {
    iVar10 = iVar12;
  }
LAB_0129a0cf:
  uVar3 = uVar14;
  if (iVar10 != 3) {
    local_b0 = uVar4;
    if (iVar10 != 0) goto LAB_0129a18f;
LAB_0129a0ed:
    bVar6 = string_ptr[uVar8 + uVar3];
    bVar16 = false;
    uVar7 = (uint)bVar6;
    if (bVar6 < 0x20) {
      local_b0 = uVar4;
      if (4 < uVar7 - 9) goto LAB_0129a191;
    }
    else {
      if ((bVar6 == 0x65) || (uVar7 == 0x45)) {
        local_b0 = uVar4;
        if ((uVar3 == uVar4) || (uVar2 <= uVar3 + 1)) goto LAB_0129a18f;
        local_a0._M_dataplus._M_p._0_2_ = 0;
        pcVar11 = string_ptr + uVar8 + uVar3 + 1;
        iVar9 = ~uVar8 + (string_size - uVar3);
        if (*pcVar11 == '-') {
          bVar16 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)44>
                             (pcVar11,iVar9,(IntegerCastData<short> *)&local_a0,strict);
        }
        else {
          bVar16 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)44>
                             (pcVar11,iVar9,(IntegerCastData<short> *)&local_a0,strict);
        }
        if (bVar16 != false) {
          bVar16 = DecimalCastOperation::HandleExponent<duckdb::DecimalCastData<int>,false>
                             (&local_d0,(int)(short)local_a0._M_dataplus._M_p);
          parameters = local_c0;
          result = local_b8;
          goto LAB_0129a191;
        }
        goto LAB_0129a337;
      }
      local_b0 = uVar4;
      if (uVar7 != 0x20) goto LAB_0129a191;
    }
    uVar5 = uVar3 + 1;
    uVar3 = uVar5;
    if (uVar5 < uVar2) {
      do {
        if ((4 < (byte)string_ptr[uVar8 + uVar5] - 9) &&
           (local_b0 = uVar4, string_ptr[uVar8 + uVar5] != 0x20)) goto LAB_0129a18f;
        uVar5 = uVar5 + 1;
        uVar3 = uVar2;
      } while (uVar2 != uVar5);
    }
  }
LAB_01299e46:
  local_b0 = uVar4;
  bVar16 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<int>,false>(&local_d0);
  if (bVar16) {
    bVar16 = local_b0 < uVar3;
    parameters = local_c0;
    result = local_b8;
    goto LAB_0129a191;
  }
LAB_0129a337:
  bVar16 = false;
  parameters = local_c0;
  result = local_b8;
LAB_0129a191:
  if (bVar16 == false) {
    local_80 = (uint)string_size;
    uVar7 = uVar13;
    local_c0 = parameters;
    if (local_80 < 0xd) {
      uStack_78._4_4_ = 0;
      local_7c = 0;
      uStack_78._0_4_ = 0;
      uStack_78 = (char *)0x0;
      if (local_80 != 0) {
        switchD_012dd528::default(&local_7c,string_ptr,(ulong)(local_80 & 0xf));
        uStack_78 = (char *)CONCAT44(uStack_78._4_4_,(undefined4)uStack_78);
      }
    }
    else {
      local_7c = *(undefined4 *)string_ptr;
      uStack_78 = string_ptr;
    }
    local_50[0] = local_40;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"Could not convert string \"%s\" to DECIMAL(%d,%d)","");
    pcVar11 = (char *)&local_7c;
    if (0xc < (ulong)local_80) {
      pcVar11 = uStack_78;
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,pcVar11,pcVar11 + local_80);
    StringUtil::Format<std::__cxx11::string,int,int>
              (&local_a0,(StringUtil *)local_50,&local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)width,
               uVar13 & 0xff,uVar7);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    HandleCastError::AssignError(&local_a0,local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT62(local_a0._M_dataplus._M_p._2_6_,(short)local_a0._M_dataplus._M_p) !=
        &local_a0.field_2) {
      operator_delete((undefined1 *)
                      CONCAT62(local_a0._M_dataplus._M_p._2_6_,(short)local_a0._M_dataplus._M_p));
    }
  }
  else {
    *result = local_d0.result;
  }
  return bVar16;
}

Assistant:

bool TryDecimalStringCast(const char *string_ptr, idx_t string_size, T &result, CastParameters &parameters,
                          uint8_t width, uint8_t scale) {
	DecimalCastData<T> state;
	state.result = 0;
	state.width = width;
	state.scale = scale;
	state.digit_count = 0;
	state.decimal_count = 0;
	state.excessive_decimals = 0;
	state.exponent_type = ExponentType::NONE;
	state.round_set = false;
	state.should_round = false;
	state.limit = UnsafeNumericCast<T>(DecimalCastTraits<T>::POWERS_OF_TEN_CLASS::POWERS_OF_TEN[width]);
	if (!TryIntegerCast<DecimalCastData<T>, true, true, DecimalCastOperation, false, decimal_separator>(
	        string_ptr, string_size, state, false)) {
		string_t value(string_ptr, (uint32_t)string_size);
		string error = StringUtil::Format("Could not convert string \"%s\" to DECIMAL(%d,%d)", value.GetString(),
		                                  (int)width, (int)scale);
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	result = state.result;
	return true;
}